

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O0

bool __thiscall iDynTree::SensorsList::isConsistent(SensorsList *this,Model *model)

{
  bool bVar1;
  int iVar2;
  reference ppSVar3;
  undefined8 in_RSI;
  bool isCurrentSensorConsistent;
  ConstIterator *unaff_retaddr;
  ConstIterator it;
  bool isConsistent;
  bool local_32;
  SensorsList *in_stack_ffffffffffffffd0;
  bool local_11;
  
  local_11 = true;
  allSensorsIterator(in_stack_ffffffffffffffd0);
  while( true ) {
    bVar1 = ConstIterator::isValid(unaff_retaddr);
    if (!bVar1) break;
    ppSVar3 = ConstIterator::operator*((ConstIterator *)0x47542c);
    iVar2 = (*(*ppSVar3)->_vptr_Sensor[7])(*ppSVar3,in_RSI);
    local_32 = false;
    if (local_11 != false) {
      local_32 = (bool)((byte)iVar2 & 1);
    }
    local_11 = local_32;
    ConstIterator::operator++(unaff_retaddr);
  }
  return local_11;
}

Assistant:

bool SensorsList::isConsistent(const Model& model) const
{
    bool isConsistent = true;
    for (SensorsList::ConstIterator it = this->allSensorsIterator();
         it.isValid(); ++it)
    {
        bool isCurrentSensorConsistent = (*it)->isConsistent(model);
        isConsistent = isConsistent && isCurrentSensorConsistent;
    }
    return isConsistent;
}